

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SqlGenerator.cpp
# Opt level: O1

void __thiscall
SqlGenerator::generateCode(SqlGenerator *this,bool hasApplicationHandler,bool hasDynamicFunctions)

{
  generateLoadQuery(this);
  generateJoinQuery(this);
  generateLmfaoQuery(this);
  generateAggregateQueries(this);
  generateOutputQueries(this);
  return;
}

Assistant:

void SqlGenerator::generateCode(bool hasApplicationHandler,
                                bool hasDynamicFunctions)
{
    DINFO("Starting SQL - Generator \n");

    hasApplicationHandler = true;
    hasDynamicFunctions = true;
    
    generateLoadQuery();
    generateJoinQuery();
    generateLmfaoQuery();
    generateAggregateQueries();
    generateOutputQueries();
}